

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sspm.cpp
# Opt level: O0

void __thiscall pg::SSPMSolver::to_tmp(SSPMSolver *this,int idx)

{
  int local_44;
  undefined1 local_40 [4];
  int i_1;
  undefined1 local_30 [28];
  int i;
  int base;
  int idx_local;
  SSPMSolver *this_local;
  
  local_30._24_4_ = idx * this->l;
  i = idx;
  _base = this;
  for (local_30._20_4_ = 0; (int)local_30._20_4_ < this->l; local_30._20_4_ = local_30._20_4_ + 1) {
    bitset::operator[]((bitset *)local_30,(size_t)&this->pm_b);
    bitset::operator[]((bitset *)local_40,(size_t)&this->tmp_b);
    bitset::reference::operator=((reference *)local_40,(reference *)local_30);
  }
  for (local_44 = 0; local_44 < this->l; local_44 = local_44 + 1) {
    this->tmp_d[local_44] = this->pm_d[local_30._24_4_ + local_44];
  }
  return;
}

Assistant:

void
SSPMSolver::to_tmp(int idx)
{
    int base = idx*l;
    for (int i=0; i<l; i++) tmp_b[i] = pm_b[base+i];
    for (int i=0; i<l; i++) tmp_d[i] = pm_d[base+i];
}